

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

Stream * rw::ps2::readADC(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  FILE *__stream;
  bool bVar1;
  int32 iVar2;
  uint uVar3;
  char *pcVar4;
  void *pvVar5;
  uint32 local_40;
  int32 size;
  Error _e;
  ADCData *adc;
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  _e = (Error)((long)object + (long)offset);
  bVar1 = findChunk(stream,0x134,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    iVar2 = Stream::readI32(stream);
    *(int32 *)((long)_e + 0x10) = iVar2;
    *(undefined4 *)_e = 1;
    stream_local = stream;
    if (*(int *)((long)_e + 0x10) == 0) {
      *(undefined8 *)((long)_e + 8) = 0;
      *(undefined4 *)((long)_e + 0x10) = 0;
    }
    else {
      uVar3 = *(int *)((long)_e + 0x10) + 3U & 0xfffffffc;
      pvVar5 = mustmalloc_LOC((long)(int)uVar3,0x30134,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 1276"
                             );
      *(void **)((long)_e + 8) = pvVar5;
      (*stream->_vptr_Stream[4])(stream,*(undefined8 *)((long)_e + 8),(ulong)uVar3);
    }
  }
  else {
    local_40 = 2;
    size = -0x7ffffffc;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp"
            ,0x4f1);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000004,"ADC");
    fprintf(__stream,"%s\n",pcVar4);
    setError((Error *)&stack0xffffffffffffffc0);
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

static Stream*
readADC(Stream *stream, int32, void *object, int32 offset, int32)
{
	ADCData *adc = PLUGINOFFSET(ADCData, object, offset);
	if(!findChunk(stream, ID_ADC, nil, nil)){
		RWERROR((ERR_CHUNK, "ADC"));
		return nil;
	}
	adc->numBits = stream->readI32();
	adc->adcFormatted = 1;
	if(adc->numBits == 0){
		adc->adcBits = nil;
		adc->numBits = 0;
		return stream;
	}
	int32 size = adc->numBits+3 & ~3;
	adc->adcBits = rwNewT(int8, size, MEMDUR_EVENT | ID_ADC);
	stream->read8(adc->adcBits, size);
	return stream;
}